

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::joinStrings(Interpreter *this)

{
  value_type pHVar1;
  Frame *pFVar2;
  HeapEntity *this_00;
  UString *v;
  UString *pUVar3;
  const_reference ppHVar4;
  Interpreter *in_RDI;
  Value VVar5;
  HeapThunk *th;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elements;
  Frame *f;
  BindingFrame *in_stack_00000088;
  uint in_stack_00000094;
  HeapObject *in_stack_00000098;
  HeapEntity *in_stack_000000a0;
  LocationRange *in_stack_000000a8;
  Stack *in_stack_000000b0;
  Value *in_stack_000001c8;
  uint in_stack_000001d4;
  Value *in_stack_000001d8;
  UString *in_stack_000001e0;
  bool *in_stack_000001e8;
  Interpreter *in_stack_000001f0;
  undefined4 uStack_34;
  
  pFVar2 = Stack::top((Stack *)0x23dddc);
  this_00 = (pFVar2->val2).v.h + 1;
  while( true ) {
    v = (UString *)(ulong)pFVar2->elementId;
    pUVar3 = (UString *)
             std::
             vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)this_00);
    if (pUVar3 <= v) {
      VVar5 = makeString(in_RDI,v);
      *(ulong *)&in_RDI->scratch = CONCAT44(uStack_34,VVar5.t);
      (in_RDI->scratch).v = VVar5.v;
      return (AST *)0x0;
    }
    ppHVar4 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)this_00,(ulong)pFVar2->elementId);
    pHVar1 = *ppHVar4;
    if (((pHVar1->super_HeapEntity).field_0xa & 1) == 0) break;
    joinString(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
               in_stack_000001d4,in_stack_000001c8);
    pFVar2->elementId = pFVar2->elementId + 1;
  }
  Stack::newCall(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                 in_stack_00000094,in_stack_00000088);
  return pHVar1->body;
}

Assistant:

const AST *joinStrings(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val2.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                joinString(f.first, f.str, f.val, f.elementId, th->content);
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(f.str);
        return nullptr;
    }